

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ApiExit(sqlite3 *db,int rc)

{
  int in_ESI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  if ((*(char *)(in_RDI + 0x67) == '\0') && (in_ESI == 0)) {
    local_4 = 0;
  }
  else {
    local_4 = apiHandleError((sqlite3 *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),0);
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3ApiExit(sqlite3* db, int rc){
  /* If the db handle must hold the connection handle mutex here.
  ** Otherwise the read (and possible write) of db->mallocFailed
  ** is unsafe, as is the call to sqlite3Error().
  */
  assert( db!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  if( db->mallocFailed || rc ){
    return apiHandleError(db, rc);
  }
  return 0;
}